

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_udunits.cpp
# Opt level: O3

void __thiscall UDUNITS_derivedAlias_Test::TestBody(UDUNITS_derivedAlias_Test *this)

{
  double dVar1;
  char cVar2;
  XMLError XVar3;
  XMLElement *pXVar4;
  char *pcVar5;
  uint64_t uVar6;
  XMLElement *pXVar7;
  size_t sVar8;
  ostream *poVar9;
  unit uVar10;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  undefined4 uVar11;
  undefined4 uVar12;
  precise_unit pVar13;
  int failConvert;
  string def;
  XMLDocument doc;
  unit local_3f0;
  AssertHelper local_3e8;
  undefined1 local_3e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  unit local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b8;
  double local_3b0;
  XMLElement *local_3a8;
  string local_3a0;
  XMLElement *local_380;
  string local_378;
  string local_358;
  XMLDocument local_338;
  
  tinyxml2::XMLDocument::XMLDocument(&local_338,true,PRESERVE_WHITESPACE);
  XVar3 = tinyxml2::XMLDocument::LoadFile
                    (&local_338,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/UDUNITS2/udunits2-derived.xml"
                    );
  local_3c0.multiplier_._0_1_ = XVar3 == XML_SUCCESS;
  local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (XVar3 == XML_SUCCESS) {
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&local_338.super_XMLNode,"unit-system");
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"unit");
    local_3e8.data_._0_4_ = 0;
    if (pXVar4 != (XMLElement *)0x0) {
      do {
        local_3a8 = pXVar4;
        pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"def");
        if (pXVar4 == (XMLElement *)0x0) {
          local_3e0 = (undefined1  [8])&local_3d0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"rad","");
        }
        else {
          pcVar5 = tinyxml2::XMLNode::Value((pXVar4->super_XMLNode)._firstChild);
          std::__cxx11::string::string((string *)local_3e0,pcVar5,(allocator *)&local_3c0);
        }
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a0,local_3e0,
                   (char *)((long)local_3e0 + (long)&local_3d8->_M_dataplus));
        uVar6 = units::getDefaultFlags();
        pVar13 = units::unit_from_string(&local_3a0,uVar6);
        local_3b0 = pVar13.multiplier_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
        }
        pXVar4 = tinyxml2::XMLNode::FirstChildElement(&local_3a8->super_XMLNode,"aliases");
        if (pXVar4 == (XMLElement *)0x0) {
          pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&local_3a8->super_XMLNode,"unit");
        }
        else {
          local_380 = pXVar4;
          pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"name");
          uVar10 = (unit)((ulong)(uint)(float)local_3b0 | pVar13._8_8_ << 0x20);
          for (; pXVar4 != (XMLElement *)0x0;
              pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,"name")) {
            pXVar7 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"singular");
            pcVar5 = tinyxml2::XMLNode::Value((pXVar7->super_XMLNode)._firstChild);
            std::__cxx11::string::string((string *)&local_358,pcVar5,(allocator *)&local_3c0);
            uVar6 = units::getDefaultFlags();
            pVar13 = units::unit_from_string(&local_358,uVar6);
            uVar11 = pVar13.multiplier_._0_4_;
            uVar12 = pVar13.multiplier_._4_4_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              local_3b0 = pVar13.multiplier_;
              operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1
                             );
              uVar11 = SUB84(local_3b0,0);
              uVar12 = (undefined4)((ulong)local_3b0 >> 0x20);
            }
            if ((pVar13._8_8_ & 0xffffffff) == 0xfa94a488 ||
                (NAN((double)CONCAT44(uVar12,uVar11)) || NAN((double)CONCAT44(uVar12,uVar11)))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"unable to convert ",0x12);
              if (pcVar5 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1bf430);
              }
              else {
                sVar8 = strlen(pcVar5);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar5,sVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," into a valid unit def=",0x17);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(char *)local_3e0,(long)local_3d8);
              local_3c0.multiplier_._0_1_ = 10;
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_3c0,1);
LAB_0012b5b8:
              local_3e8.data_._0_4_ = (int)local_3e8.data_ + 1;
            }
            else {
              local_3c0 = (unit)((ulong)(uint)(float)(double)CONCAT44(uVar12,uVar11) |
                                pVar13._8_8_ << 0x20);
              local_3f0 = uVar10;
              dVar1 = units::convert<units::unit,units::unit>(1.0,&local_3c0,&local_3f0);
              if ((dVar1 != 1.0) || (NAN(dVar1))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"name and unit do not match ",0x1b);
                if (pcVar5 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1bf430);
                }
                else {
                  sVar8 = strlen(pcVar5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pcVar5,sVar8);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," and ",5);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(char *)local_3e0,(long)local_3d8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                goto LAB_0012b5b8;
              }
            }
          }
          for (pXVar4 = tinyxml2::XMLNode::FirstChildElement(&local_380->super_XMLNode,"symbol");
              pXVar4 != (XMLElement *)0x0;
              pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,"symbol")) {
            pcVar5 = tinyxml2::XMLNode::Value((pXVar4->super_XMLNode)._firstChild);
            std::__cxx11::string::string((string *)&local_378,pcVar5,(allocator *)&local_3c0);
            uVar6 = units::getDefaultFlags();
            pVar13 = units::unit_from_string(&local_378,uVar6);
            uVar11 = pVar13.multiplier_._0_4_;
            uVar12 = pVar13.multiplier_._4_4_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              local_3b0 = pVar13.multiplier_;
              operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1
                             );
              uVar11 = SUB84(local_3b0,0);
              uVar12 = (undefined4)((ulong)local_3b0 >> 0x20);
            }
            if ((pVar13._8_8_ & 0xffffffff) == 0xfa94a488 ||
                (NAN((double)CONCAT44(uVar12,uVar11)) || NAN((double)CONCAT44(uVar12,uVar11)))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"unable to convert ",0x12);
              if (pcVar5 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1bf430);
              }
              else {
                sVar8 = strlen(pcVar5);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar5,sVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," into a valid unit def=",0x17);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(char *)local_3e0,(long)local_3d8);
              local_3c0.multiplier_._0_1_ = 10;
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_3c0,1);
LAB_0012b7c2:
              local_3e8.data_._0_4_ = (int)local_3e8.data_ + 1;
            }
            else {
              local_3c0 = (unit)((ulong)(uint)(float)(double)CONCAT44(uVar12,uVar11) |
                                pVar13._8_8_ << 0x20);
              local_3f0 = uVar10;
              dVar1 = units::convert<units::unit,units::unit>(1.0,&local_3c0,&local_3f0);
              if ((dVar1 != 1.0) || (NAN(dVar1))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"name and unit do not match ",0x1b);
                if (pcVar5 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1bf430);
                }
                else {
                  sVar8 = strlen(pcVar5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pcVar5,sVar8);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," and ",5);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(char *)local_3e0,(long)local_3d8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                goto LAB_0012b7c2;
              }
            }
          }
          pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&local_3a8->super_XMLNode,"unit");
        }
        if (local_3e0 != (undefined1  [8])&local_3d0) {
          operator_delete((void *)local_3e0,local_3d0._M_allocated_capacity + 1);
        }
      } while (pXVar4 != (XMLElement *)0x0);
    }
    local_3c0 = (unit)((ulong)local_3c0 & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_3e0,"failConvert","0",(int *)&local_3e8,(int *)&local_3c0);
    if (local_3e0[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_3c0);
      if (local_3d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_3d8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_3f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
                 ,0x105,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_3f0,(Message *)&local_3c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3f0);
      if (local_3c0 != (unit)0x0) {
        (**(code **)(*(long *)local_3c0 + 8))();
      }
    }
    if (local_3d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0012b8d4;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3d8;
  }
  else {
    testing::Message::Message((Message *)&local_3f0);
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3b8;
    std::ostream::operator<<((ostream *)((long)local_3f0 + 0x10),XVar3);
    cVar2 = local_3f0.multiplier_._0_1_ + '\x10';
    std::ios::widen((char)*(undefined8 *)(*(long *)((long)local_3f0 + 0x10) + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3e0,(internal *)&local_3c0,(AssertionResult *)0x17f8e8,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
               ,0xcb,(char *)local_3e0);
    testing::internal::AssertHelper::operator=(&local_3e8,(Message *)&local_3f0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    if (local_3e0 != (undefined1  [8])&local_3d0) {
      operator_delete((void *)local_3e0,local_3d0._M_allocated_capacity + 1);
    }
    if (local_3f0 != (unit)0x0) {
      (**(code **)(*(long *)local_3f0 + 8))();
    }
    local_3d8 = local_3b8;
    if (local_3b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0012b8d4;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_3d8);
LAB_0012b8d4:
  tinyxml2::XMLDocument::~XMLDocument(&local_338);
  return;
}

Assistant:

TEST(UDUNITS, derivedAlias)
{
    tinyxml2::XMLDocument doc;
    auto err = doc.LoadFile(TEST_FILE_FOLDER "/UDUNITS2/udunits2-derived.xml");
    ASSERT_FALSE(err) << err << std::endl;
    auto cs = doc.FirstChildElement("unit-system")->FirstChildElement("unit");
    int failConvert = 0;
    while (cs != nullptr) {
        auto defEl = cs->FirstChildElement("def");
        // the only one without a definition is the radian since it is
        // dimensionless according to the xml
        std::string def =
            (defEl) ? defEl->FirstChild()->Value() : std::string("rad");

        auto definitionUnit = units::unit_from_string(def);

        auto alias = cs->FirstChildElement("aliases");
        if (alias == nullptr) {
            cs = cs->NextSiblingElement("unit");
            continue;
        }
        auto name = alias->FirstChildElement("name");
        while (name != nullptr) {
            auto sname =
                name->FirstChildElement("singular")->FirstChild()->Value();
            auto nameUnit = units::unit_from_string(sname);
            if (is_error(nameUnit)) {
                std::cout << "unable to convert " << sname
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (convert(unit_cast(nameUnit), unit_cast(definitionUnit)) !=
                    1.0) {
                    std::cout << "name and unit do not match " << sname
                              << " and " << def << "\n";
                    ++failConvert;
                }
            }
            name = name->NextSiblingElement("name");
        }
        // check for symbols
        auto sym = alias->FirstChildElement("symbol");
        while (sym != nullptr) {
            auto symString = sym->FirstChild()->Value();
            auto symUnit = units::unit_from_string(symString);
            if (is_error(symUnit)) {
                std::cout << "unable to convert " << symString
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (convert(unit_cast(symUnit), unit_cast(definitionUnit)) !=
                    1.0) {
                    std::cout << "name and unit do not match " << symString
                              << " and " << def << "\n";
                    ++failConvert;
                }
            }
            sym = sym->NextSiblingElement("symbol");
        }

        cs = cs->NextSiblingElement("unit");
    }
    EXPECT_EQ(failConvert, 0);
}